

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastEr1R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this;
  uchar uVar4;
  bool bVar5;
  uint16_t uVar6;
  unsigned_short uVar7;
  uint uVar8;
  char *pcVar9;
  uint *puVar10;
  ulong uVar11;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  bool local_201;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_1a0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_198;
  byte local_18b;
  byte local_18a;
  uchar local_189;
  uint8_t v;
  uint8_t max;
  RepeatedField<int> *pRStack_188;
  uchar expected_tag;
  RepeatedField<int> *field;
  uint64_t local_178;
  TcParseTableBase *local_170;
  ParseContext *local_168;
  char *local_160;
  MessageLite *local_158;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_150;
  TcFieldData local_148;
  TcFieldData local_140;
  undefined1 local_131;
  uint64_t uStack_130;
  bool always_return;
  TcParseTableBase *local_128;
  ParseContext *local_120;
  char *local_118;
  MessageLite *local_110;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_108;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_100;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_f8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  uint32_t has_bits_offset_1;
  
  local_178 = hasbits;
  local_170 = table;
  local_168 = ctx;
  local_160 = ptr;
  local_158 = msg;
  local_150 = data.field_0;
  uVar4 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_150);
  pMVar2 = local_158;
  pcVar9 = local_160;
  pPVar1 = local_168;
  if (uVar4 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&field);
    pcVar9 = MiniParse(pMVar2,pcVar9,pPVar1,(TcFieldData)field,local_170,local_178);
    return pcVar9;
  }
  uVar6 = TcFieldData::offset((TcFieldData *)&local_150);
  pRStack_188 = RefAt<google::protobuf::RepeatedField<int>>(pMVar2,(ulong)uVar6);
  local_189 = UnalignedLoad<unsigned_char>(local_160);
  local_18a = TcFieldData::aux_idx((TcFieldData *)&local_150);
  do {
    pMVar2 = local_158;
    pcVar9 = local_160;
    pPVar1 = local_168;
    local_18b = local_160[1];
    local_201 = local_18b == 0 || local_18a < local_18b;
    if (local_201) {
      TcFieldData::TcFieldData((TcFieldData *)&local_198);
      pcVar9 = MiniParse(pMVar2,pcVar9,pPVar1,(TcFieldData)local_198,local_170,local_178);
      return pcVar9;
    }
    RepeatedField<int>::Add(pRStack_188,(uint)local_18b);
    local_160 = local_160 + 2;
    bVar5 = EpsCopyInputStream::DataAvailable(&local_168->super_EpsCopyInputStream,local_160);
    pMVar2 = local_158;
    pcVar9 = local_160;
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_1a0);
      if (local_170->has_bits_offset != 0) {
        uVar8 = (uint)local_178;
        puVar10 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_170->has_bits_offset);
        *puVar10 = uVar8 | *puVar10;
      }
      return pcVar9;
    }
    uVar4 = UnalignedLoad<unsigned_char>(local_160);
    local_110 = local_158;
    local_118 = local_160;
    local_120 = local_168;
  } while (uVar4 == local_189);
  TcFieldData::TcFieldData(&data_local);
  local_108 = data_local.field_0;
  local_128 = local_170;
  uStack_130 = local_178;
  local_131 = 0;
  bVar5 = EpsCopyInputStream::DataAvailable(&local_120->super_EpsCopyInputStream,local_118);
  pMVar2 = local_110;
  pcVar9 = local_118;
  pPVar1 = local_120;
  if (!bVar5) {
    TcFieldData::TcFieldData(&local_140);
    if (local_128->has_bits_offset != 0) {
      uVar8 = (uint)uStack_130;
      puVar10 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_128->has_bits_offset);
      *puVar10 = uVar8 | *puVar10;
    }
    return pcVar9;
  }
  TcFieldData::TcFieldData(&local_148);
  this = local_128;
  uVar3 = uStack_130;
  uVar7 = UnalignedLoad<unsigned_short>(pcVar9);
  uVar11 = (ulong)(int)((uint)uVar7 & (uint)this->fast_idx_mask);
  if ((uVar11 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  data_1.field_0 =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(this,uVar11 >> 3);
  local_f8.data =
       ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
       (ulong)uVar7;
  UNRECOVERED_JUMPTABLE = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0)
  ;
  local_100.data = local_f8.data;
  pcVar9 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar9,pPVar1,(TcFieldData)local_f8,this,uVar3);
  return pcVar9;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEr1R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnumSmallRange<uint8_t, 1>(
      PROTOBUF_TC_PARAM_PASS);
}